

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reorg.cpp
# Opt level: O2

int __thiscall ncnn::Reorg::forward(Reorg *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  undefined4 *puVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  undefined4 *puVar16;
  undefined4 *puVar17;
  undefined4 *puVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  undefined4 *puVar24;
  int _h;
  ulong uVar25;
  undefined4 *local_98;
  
  uVar1 = bottom_blob->c;
  iVar9 = this->stride;
  uVar23 = (long)bottom_blob->w / (long)iVar9;
  uVar25 = (long)bottom_blob->h / (long)iVar9;
  iVar22 = (int)uVar23;
  _h = (int)uVar25;
  Mat::create(top_blob,iVar22,_h,uVar1 * iVar9 * iVar9,bottom_blob->elemsize,opt->blob_allocator);
  iVar9 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    local_98 = (undefined4 *)bottom_blob->data;
    uVar23 = uVar23 & 0xffffffff;
    if (iVar22 < 1) {
      uVar23 = 0;
    }
    sVar3 = bottom_blob->elemsize;
    uVar25 = uVar25 & 0xffffffff;
    if (_h < 1) {
      uVar25 = 0;
    }
    uVar8 = this->stride;
    if (this->stride < 1) {
      uVar8 = 0;
    }
    uVar11 = 0;
    if (0 < (int)uVar1) {
      uVar11 = (ulong)uVar1;
    }
    sVar4 = bottom_blob->cstep;
    lVar14 = (long)bottom_blob->w * sVar3;
    for (uVar20 = 0; uVar20 != uVar11; uVar20 = uVar20 + 1) {
      uVar2 = this->stride;
      uVar10 = 0;
      if (0 < (int)uVar2) {
        uVar10 = (ulong)uVar2;
      }
      puVar17 = local_98;
      for (uVar15 = 0; uVar15 != uVar8; uVar15 = uVar15 + 1) {
        iVar9 = this->mode;
        pvVar5 = top_blob->data;
        sVar6 = top_blob->cstep;
        sVar7 = top_blob->elemsize;
        puVar16 = puVar17;
        for (uVar21 = 0; uVar21 != uVar10; uVar21 = uVar21 + 1) {
          iVar22 = (int)uVar20 + uVar1 * ((int)uVar15 * uVar2 + (int)uVar21);
          if (iVar9 == 0) {
            iVar22 = ((int)uVar15 + (int)uVar20 * uVar2) * uVar2 + (int)uVar21;
          }
          puVar18 = (undefined4 *)((long)iVar22 * sVar6 * sVar7 + (long)pvVar5);
          iVar22 = this->stride;
          puVar24 = puVar16;
          for (uVar19 = 0; puVar12 = puVar24, uVar13 = uVar23, uVar19 != uVar25; uVar19 = uVar19 + 1
              ) {
            while ((int)uVar13 != 0) {
              *puVar18 = *puVar12;
              puVar18 = puVar18 + 1;
              puVar12 = puVar12 + iVar22;
              uVar13 = (ulong)((int)uVar13 - 1);
            }
            puVar24 = (undefined4 *)((long)puVar24 + lVar14 * iVar22);
          }
          puVar16 = puVar16 + 1;
        }
        puVar17 = (undefined4 *)((long)puVar17 + lVar14);
      }
      local_98 = (undefined4 *)((long)local_98 + sVar4 * sVar3);
    }
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

int Reorg::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int outw = w / stride;
    int outh = h / stride;
    int outc = channels * stride * stride;

    top_blob.create(outw, outh, outc, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const Mat m = bottom_blob.channel(q);

        for (int sh = 0; sh < stride; sh++)
        {
            for (int sw = 0; sw < stride; sw++)
            {
                int p;
                if (mode == 0)
                    p = q * stride * stride + sh * stride + sw;
                else // if (mode == 1)
                    p = (sh * stride + sw) * channels + q;

                float* outptr = top_blob.channel(p);

                for (int i = 0; i < outh; i++)
                {
                    const float* sptr = m.row(i * stride + sh) + sw;
                    for (int j = 0; j < outw; j++)
                    {
                        outptr[0] = sptr[0];

                        sptr += stride;
                        outptr++;
                    }
                }
            }
        }
    }

    return 0;
}